

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_status gVar1;
  
  gVar1 = ggml_backend_sched_graph_compute_async(sched,graph);
  ggml_backend_sched_synchronize(sched);
  return gVar1;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    enum ggml_status err = ggml_backend_sched_graph_compute_async(sched, graph);
    ggml_backend_sched_synchronize(sched);
    return err;
}